

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.h
# Opt level: O2

void __thiscall
Liby::WeakTimerHolder::WeakTimerHolder(WeakTimerHolder *this,shared_ptr<Liby::Timer> *timer)

{
  element_type *peVar1;
  __suseconds_t _Var2;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  peVar1 = (timer->super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28 = 0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  (this->timer_).id_ = peVar1->id_;
  _Var2 = (peVar1->timeout_).tv_.tv_usec;
  (this->timer_).timeout_.tv_.tv_sec = (peVar1->timeout_).tv_.tv_sec;
  (this->timer_).timeout_.tv_.tv_usec = _Var2;
  std::function<void_()>::function(&(this->timer_).handler_,(function<void_()> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  std::__weak_ptr<Liby::Timer,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<Liby::Timer,void>
            ((__weak_ptr<Liby::Timer,(__gnu_cxx::_Lock_policy)2> *)&this->weakTimerPtr_,
             &timer->super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

WeakTimerHolder(const std::shared_ptr<Timer> &timer)
        : timer_(timer->id(), timer->timeout(), nullptr), weakTimerPtr_(timer) {
    }